

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall
QMakeParser::finalizeCall(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int argc)

{
  ushort uVar1;
  ProFile *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  short *psVar7;
  BlockScope *pBVar8;
  qsizetype qVar9;
  ulong uVar10;
  long in_RCX;
  short *in_RDX;
  QMakeParser *in_RSI;
  QMakeParser *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  uint nlen_2;
  uint nlen_1;
  ushort defType;
  QString *defName;
  ushort *uce;
  uint nlen;
  QString *in_stack_fffffffffffffa78;
  QString *pQVar25;
  QMakeParser *in_stack_fffffffffffffa80;
  QMakeParser *in_stack_fffffffffffffa88;
  uint len;
  QMakeParser *in_stack_fffffffffffffa90;
  QString *in_stack_fffffffffffffa98;
  QMakeParser *in_stack_fffffffffffffaa0;
  ushort **in_stack_fffffffffffffaa8;
  QMakeParser *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffac8;
  QChar QVar26;
  undefined2 local_4da;
  short *local_4b8;
  storage_type *local_350;
  undefined1 local_340 [30];
  QChar local_322;
  storage_type *local_320;
  undefined1 local_310 [48];
  storage_type *local_2e0;
  undefined1 local_2d0 [30];
  QChar local_2b2;
  storage_type *local_2b0;
  undefined1 local_2a0 [54];
  QChar local_26a;
  storage_type *local_268;
  undefined1 local_258 [54];
  QChar local_222;
  storage_type *local_220;
  undefined1 local_210 [48];
  storage_type *local_1e0;
  undefined1 local_1d0 [24];
  storage_type *local_1b8;
  undefined1 local_1a8 [30];
  QChar local_18a;
  storage_type *local_188;
  undefined1 local_178 [54];
  QChar local_142;
  storage_type *local_140;
  undefined1 local_130 [54];
  QChar local_fa;
  storage_type *local_f8;
  undefined1 local_e8 [54];
  QChar local_b2;
  storage_type *local_b0;
  undefined1 local_a0 [48];
  storage_type *local_70;
  undefined1 local_60 [24];
  storage_type *local_48;
  undefined1 local_38 [48];
  long local_8;
  
  QVar26.ucs = (char16_t)((ulong)in_stack_fffffffffffffac8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDX != 9) || (psVar7 = in_RDX + (ulong)(ushort)in_RDX[3] + 4, *psVar7 != 0x11)) {
LAB_003140a6:
    finalizeTest(in_stack_fffffffffffffa88,(ushort **)in_stack_fffffffffffffa80);
    uVar10 = in_RCX - (long)in_RDX >> 1;
    memcpy(in_RSI->m_proFile,in_RDX,(ulong)(uint)((int)uVar10 << 1));
    in_RSI->m_proFile =
         (ProFile *)((long)&(in_RSI->m_proFile->m_refCount).m_cnt + (uVar10 & 0xffffffff) * 2);
    goto LAB_0031414a;
  }
  local_4b8 = psVar7 + 1;
  QString::setRawData((QChar *)&in_RDI->m_tmp,(longlong)(in_RDX + 4));
  bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  if (!bVar3) {
    bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    if (bVar3) {
      local_4da = 0x1b;
    }
    else {
      bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      if (!bVar3) {
        bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        if (bVar3) {
          if (*local_4b8 == 0xf) {
            pBVar8 = QStack<QMakeParser::BlockScope>::top
                               ((QStack<QMakeParser::BlockScope> *)0x31368b);
            if ((pBVar8->nest & 2) == 0) {
              QByteArrayView::QByteArrayView<17ul>
                        ((QByteArrayView *)in_stack_fffffffffffffa90,
                         (char (*) [17])in_stack_fffffffffffffa88);
              QVar15.m_data = local_140;
              QVar15.m_size = (qsizetype)local_130;
              QString::fromLatin1(QVar15);
              QChar::QChar<char16_t,_true>(&local_142,L' ');
              QString::arg<QString,_true>
                        ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),QVar26);
              bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                        (QString *)in_stack_fffffffffffffa80);
              QString::~QString((QString *)0x313748);
              QString::~QString((QString *)0x313755);
            }
            else if (in_RDI->m_invert == 0) {
              flushScopes(in_stack_fffffffffffffa88,(ushort **)in_stack_fffffffffffffa80);
              putLineMarker(in_RDI,(ushort **)in_RSI);
              putOperator(in_RDI,(ushort **)in_RSI);
              pPVar2 = in_RSI->m_proFile;
              in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
              *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 0x1c;
              enterScope(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
                         (ScopeState)in_stack_fffffffffffffaa0);
            }
            else {
              QByteArrayView::QByteArrayView<42ul>
                        ((QByteArrayView *)in_stack_fffffffffffffa90,
                         (char (*) [42])in_stack_fffffffffffffa88);
              QVar16.m_data = local_188;
              QVar16.m_size = (qsizetype)local_178;
              QString::fromLatin1(QVar16);
              QVar26.ucs = (char16_t)((ulong)&in_RDI->m_tmp >> 0x30);
              QChar::QChar<char16_t,_true>(&local_18a,L' ');
              QString::arg<QString,_true>
                        ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),QVar26);
              bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                        (QString *)in_stack_fffffffffffffa80);
              QString::~QString((QString *)0x313819);
              QString::~QString((QString *)0x313826);
            }
          }
          else {
            QByteArrayView::QByteArrayView<30ul>
                      ((QByteArrayView *)in_stack_fffffffffffffa90,
                       (char (*) [30])in_stack_fffffffffffffa88);
            QVar14.m_data = local_f8;
            QVar14.m_size = (qsizetype)local_e8;
            QString::fromLatin1(QVar14);
            QChar::QChar<char16_t,_true>(&local_fa,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                       (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),QVar26);
            bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                      (QString *)in_stack_fffffffffffffa80);
            QString::~QString((QString *)0x313668);
            QString::~QString((QString *)0x313675);
          }
          goto LAB_0031414a;
        }
        bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        if (bVar3) {
          pBVar8 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x313906)
          ;
          if ((pBVar8->nest & 2) == 0) {
            if (*local_4b8 != 0xf) {
              QByteArrayView::QByteArrayView<44ul>
                        ((QByteArrayView *)in_stack_fffffffffffffa90,
                         (char (*) [44])in_stack_fffffffffffffa88);
              QVar18.m_data = local_1e0;
              QVar18.m_size = (qsizetype)local_1d0;
              QString::fromLatin1(QVar18);
              bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                        (QString *)in_stack_fffffffffffffa80);
              QString::~QString((QString *)0x3139fd);
              goto LAB_0031414a;
            }
          }
          else if (1 < in_R8D) {
            QByteArrayView::QByteArrayView<40ul>
                      ((QByteArrayView *)in_stack_fffffffffffffa90,
                       (char (*) [40])in_stack_fffffffffffffa88);
            QVar17.m_data = local_1b8;
            QVar17.m_size = (qsizetype)local_1a8;
            QString::fromLatin1(QVar17);
            bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                      (QString *)in_stack_fffffffffffffa80);
            QString::~QString((QString *)0x313981);
            goto LAB_0031414a;
          }
          local_4da = 0x12;
        }
        else {
          bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
          if (bVar3) {
            local_4da = 0x14;
          }
          else {
            bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
            if (!bVar3) {
              bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
              if (bVar3) {
                if ((((in_RDI->m_state == StNew) &&
                     (pBVar8 = QStack<QMakeParser::BlockScope>::top
                                         ((QStack<QMakeParser::BlockScope> *)0x313e3d),
                     pBVar8->braceLevel == 0)) &&
                    (qVar9 = QList<QMakeParser::BlockScope>::size
                                       (&(in_RDI->m_blockstack).super_QList<QMakeParser::BlockScope>
                                       ), qVar9 < 2)) &&
                   ((in_RDI->m_invert == 0 && (in_RDI->m_operator == NoOperator)))) {
                  if ((*local_4b8 == 0x208) && (local_4b8[(ushort)psVar7[2] + 2] == 0xf)) {
                    QString::setRawData((QChar *)&in_RDI->m_tmp,(longlong)(psVar7 + 3));
                    bVar3 = ::operator==((QString *)in_stack_fffffffffffffa80,
                                         in_stack_fffffffffffffa78);
                    if (bVar3) {
                      ProFile::setHostBuild(in_RDI->m_proFile,true);
                    }
                    else {
                      QByteArrayView::QByteArrayView<21ul>
                                ((QByteArrayView *)in_stack_fffffffffffffa90,
                                 (char (*) [21])in_stack_fffffffffffffa88);
                      iVar4 = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
                      QVar23.m_data = local_320;
                      QVar23.m_size = (qsizetype)local_310;
                      QString::fromLatin1(QVar23);
                      pQVar25 = &in_RDI->m_tmp;
                      QChar::QChar<char16_t,_true>(&local_322,L' ');
                      QString::arg<QString,_true>
                                ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                                 iVar4,QVar26);
                      parseError(in_stack_fffffffffffffa80,pQVar25);
                      QString::~QString((QString *)0x314028);
                      QString::~QString((QString *)0x314035);
                    }
                  }
                  else {
                    QByteArrayView::QByteArrayView<40ul>
                              ((QByteArrayView *)in_stack_fffffffffffffa90,
                               (char (*) [40])in_stack_fffffffffffffa88);
                    QVar24.m_data = local_350;
                    QVar24.m_size = (qsizetype)local_340;
                    QString::fromLatin1(QVar24);
                    parseError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
                    QString::~QString((QString *)0x31408f);
                  }
                }
                else {
                  QByteArrayView::QByteArrayView<53ul>
                            ((QByteArrayView *)in_stack_fffffffffffffa90,
                             (char (*) [53])in_stack_fffffffffffffa88);
                  QVar22.m_data = local_2e0;
                  QVar22.m_size = (qsizetype)local_2d0;
                  QString::fromLatin1(QVar22);
                  bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                            (QString *)in_RSI);
                  QString::~QString((QString *)0x313edb);
                }
                goto LAB_0031414a;
              }
              goto LAB_003140a6;
            }
            local_4da = 0x13;
          }
          if (*local_4b8 != 0xf) {
            QByteArrayView::QByteArrayView<30ul>
                      ((QByteArrayView *)in_stack_fffffffffffffa90,
                       (char (*) [30])in_stack_fffffffffffffa88);
            QVar19.m_data = local_220;
            QVar19.m_size = (qsizetype)local_210;
            QString::fromLatin1(QVar19);
            QChar::QChar<char16_t,_true>(&local_222,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                       (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),QVar26);
            bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                      (QString *)in_stack_fffffffffffffa80);
            QString::~QString((QString *)0x313b37);
            QString::~QString((QString *)0x313b44);
            goto LAB_0031414a;
          }
          pBVar8 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x313b5a)
          ;
          if ((pBVar8->nest & 1) == 0) {
            QByteArrayView::QByteArrayView<17ul>
                      ((QByteArrayView *)in_stack_fffffffffffffa90,
                       (char (*) [17])in_stack_fffffffffffffa88);
            QVar20.m_data = local_268;
            QVar20.m_size = (qsizetype)local_258;
            QString::fromLatin1(QVar20);
            pQVar25 = &in_RDI->m_tmp;
            QChar::QChar<char16_t,_true>(&local_26a,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_RSI,pQVar25,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20),
                       QVar26);
            bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                      (QString *)in_stack_fffffffffffffa80);
            QString::~QString((QString *)0x313c17);
            QString::~QString((QString *)0x313c24);
            goto LAB_0031414a;
          }
        }
        if (in_RDI->m_invert == 0) {
          finalizeTest(in_stack_fffffffffffffa88,(ushort **)in_stack_fffffffffffffa80);
          uVar6 = (int)(in_RCX - (long)local_4b8 >> 1) - 1;
          memcpy(in_RSI->m_proFile,local_4b8,(ulong)(uVar6 * 2));
          in_RSI->m_proFile =
               (ProFile *)((long)&(in_RSI->m_proFile->m_refCount).m_cnt + (ulong)uVar6 * 2);
          pPVar2 = in_RSI->m_proFile;
          in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
          *(undefined2 *)&(pPVar2->m_refCount).m_cnt = local_4da;
        }
        else {
          QByteArrayView::QByteArrayView<42ul>
                    ((QByteArrayView *)in_RSI,(char (*) [42])in_stack_fffffffffffffa88);
          QVar21.m_data = local_2b0;
          QVar21.m_size = (qsizetype)local_2a0;
          QString::fromLatin1(QVar21);
          pQVar25 = &in_RDI->m_tmp;
          QChar::QChar<char16_t,_true>(&local_2b2,L' ');
          QString::arg<QString,_true>
                    ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                     (int)((ulong)in_RSI >> 0x20),QVar26);
          bogusTest(in_RSI,(ushort **)pQVar25,(QString *)in_stack_fffffffffffffa80);
          QString::~QString((QString *)0x313cea);
          QString::~QString((QString *)0x313cf7);
        }
        goto LAB_0031414a;
      }
      local_4da = 0x1a;
    }
    if (in_RDI->m_invert == 0) {
      flushScopes(in_stack_fffffffffffffa88,(ushort **)in_stack_fffffffffffffa80);
      putLineMarker(in_RDI,(ushort **)in_RSI);
      if ((*local_4b8 == 0x208) && (local_4b8[(ushort)psVar7[2] + 2] == 0xf)) {
        putOperator(in_RDI,(ushort **)in_RSI);
        pPVar2 = in_RSI->m_proFile;
        in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
        *(undefined2 *)&(pPVar2->m_refCount).m_cnt = local_4da;
        putHashStr(in_stack_fffffffffffffaa0,(ushort **)in_stack_fffffffffffffa98,
                   (ushort *)in_stack_fffffffffffffa90,
                   (uint)((ulong)in_stack_fffffffffffffa88 >> 0x20));
        enterScope(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                   SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
                   (ScopeState)in_stack_fffffffffffffaa0);
        pBVar8 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x3134c8);
        pBVar8->nest = '\x02';
      }
      else {
        QByteArrayView::QByteArrayView<44ul>
                  ((QByteArrayView *)in_stack_fffffffffffffa90,
                   (char (*) [44])in_stack_fffffffffffffa88);
        iVar4 = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
        QVar13.m_data = local_b0;
        QVar13.m_size = (qsizetype)local_a0;
        QString::fromLatin1(QVar13);
        QChar::QChar<char16_t,_true>(&local_b2,L' ');
        QString::arg<QString,_true>
                  ((QString *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,iVar4,QVar26);
        parseError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        QString::~QString((QString *)0x313570);
        QString::~QString((QString *)0x31357d);
      }
    }
    else {
      QByteArrayView::QByteArrayView<57ul>
                ((QByteArrayView *)in_stack_fffffffffffffa90,
                 (char (*) [57])in_stack_fffffffffffffa88);
      QVar12.m_data = local_70;
      QVar12.m_size = (qsizetype)local_60;
      QString::fromLatin1(QVar12);
      bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
                (QString *)in_stack_fffffffffffffa80);
      QString::~QString((QString *)0x31339d);
    }
    goto LAB_0031414a;
  }
  bVar3 = acceptColon(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  if (!bVar3) {
    QString::QString((QString *)0x312d90);
    bogusTest(in_stack_fffffffffffffa90,(ushort **)in_stack_fffffffffffffa88,
              (QString *)in_stack_fffffffffffffa80);
    QString::~QString((QString *)0x312dba);
    goto LAB_0031414a;
  }
  flushCond(in_stack_fffffffffffffa88,(ushort **)in_stack_fffffffffffffa80);
  putLineMarker(in_RDI,(ushort **)in_RSI);
  len = (uint)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  if (*local_4b8 == 0x208) {
    uVar1 = psVar7[2];
    psVar7 = psVar7 + (ulong)(uint)uVar1 + 3;
    if (psVar7 != (short *)(in_RCX + -2)) {
      if ((*psVar7 != 0xe) || (in_R8D != 2)) goto LAB_00313249;
      local_4b8 = psVar7 + 1;
      pPVar2 = in_RSI->m_proFile;
      in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
      *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 0x19;
      putHashStr(in_stack_fffffffffffffaa0,(ushort **)in_stack_fffffffffffffa98,
                 (ushort *)in_stack_fffffffffffffa90,len);
      goto LAB_003130b5;
    }
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 0x19;
    putHashStr(in_stack_fffffffffffffaa0,(ushort **)in_stack_fffffffffffffa98,
               (ushort *)in_stack_fffffffffffffa90,len);
    iVar4 = uVar1 + 5;
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(short *)&(pPVar2->m_refCount).m_cnt = (short)iVar4;
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(short *)&(pPVar2->m_refCount).m_cnt = (short)((uint)iVar4 >> 0x10);
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 9;
    putHashStr(in_stack_fffffffffffffaa0,(ushort **)in_stack_fffffffffffffa98,
               (ushort *)in_stack_fffffffffffffa90,(uint)((ulong)in_stack_fffffffffffffa88 >> 0x20))
    ;
  }
  else {
    if (in_R8D != 1) {
LAB_00313249:
      QByteArrayView::QByteArrayView<58ul>
                ((QByteArrayView *)in_stack_fffffffffffffa90,
                 (char (*) [58])in_stack_fffffffffffffa88);
      QVar11.m_data = local_48;
      QVar11.m_size = (qsizetype)local_38;
      QString::fromLatin1(QVar11);
      parseError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      QString::~QString((QString *)0x31329c);
      goto LAB_0031414a;
    }
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 0x19;
    putHashStr(in_stack_fffffffffffffaa0,(ushort **)in_stack_fffffffffffffa98,
               (ushort *)in_stack_fffffffffffffa90,len);
LAB_003130b5:
    uVar10 = (in_RCX + -2) - (long)local_4b8 >> 1;
    iVar4 = (int)uVar10;
    iVar5 = iVar4 + 1;
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(short *)&(pPVar2->m_refCount).m_cnt = (short)iVar5;
    pPVar2 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
    *(short *)&(pPVar2->m_refCount).m_cnt = (short)((uint)iVar5 >> 0x10);
    memcpy(in_RSI->m_proFile,local_4b8,(ulong)(uint)(iVar4 << 1));
    in_RSI->m_proFile =
         (ProFile *)((long)&(in_RSI->m_proFile->m_refCount).m_cnt + (uVar10 & 0xffffffff) * 2);
  }
  pPVar2 = in_RSI->m_proFile;
  in_RSI->m_proFile = (ProFile *)((long)&(pPVar2->m_refCount).m_cnt + 2);
  *(undefined2 *)&(pPVar2->m_refCount).m_cnt = 7;
  enterScope(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),(ScopeState)in_stack_fffffffffffffaa0
            );
  pBVar8 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x313006);
  pBVar8->nest = pBVar8->nest | 1;
LAB_0031414a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeParser::finalizeCall(ushort *&tokPtr, ushort *uc, ushort *ptr, int argc)
{
    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (*uce == TokTestCall) {
            uce++;
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            const QString *defName;
            ushort defType;
            if (m_tmp == statics.strfor) {
                if (!acceptColon("in front of for()")) {
                    bogusTest(tokPtr, QString());
                    return;
                }
                flushCond(tokPtr);
                putLineMarker(tokPtr);
                --ptr;
                Q_ASSERT(*ptr == TokFuncTerminator);
                if (*uce == (TokLiteral|TokNewStr)) {
                    nlen = uce[1];
                    uc = uce + 2 + nlen;
                    if (uc == ptr) {
                        // for(literal) (only "ever" would be legal if qmake was sane)
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, nullptr, (uint)0);
                        putBlockLen(tokPtr, 1 + 3 + nlen + 1);
                        putTok(tokPtr, TokHashLiteral);
                        putHashStr(tokPtr, uce + 2, nlen);
                      didFor:
                        putTok(tokPtr, TokValueTerminator);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest |= NestLoop;
                        return;
                    } else if (*uc == TokArgSeparator && argc == 2) {
                        // for(var, something)
                        uc++;
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, uce + 2, nlen);
                      doFor:
                        nlen = ptr - uc;
                        putBlockLen(tokPtr, nlen + 1);
                        putBlock(tokPtr, uc, nlen);
                        goto didFor;
                    }
                } else if (argc == 1) {
                    // for(non-literal) (this wouldn't be here if qmake was sane)
                    putTok(tokPtr, TokForLoop);
                    putHashStr(tokPtr, nullptr, (uint)0);
                    uc = uce;
                    goto doFor;
                }
                parseError(fL1S("Syntax is for(var, list), for(var, forever) or for(ever)."));
                return;
            } else if (m_tmp == statics.strdefineReplace) {
                defName = &statics.strdefineReplace;
                defType = TokReplaceDef;
                goto deffunc;
            } else if (m_tmp == statics.strdefineTest) {
                defName = &statics.strdefineTest;
                defType = TokTestDef;
              deffunc:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of function definition."));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        putOperator(tokPtr);
                        putTok(tokPtr, defType);
                        putHashStr(tokPtr, uce + 2, nlen);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest = NestFunction;
                        return;
                    }
                }
                parseError(fL1S("%1(function) requires one literal argument.").arg(*defName));
                return;
            } else if (m_tmp == statics.strbypassNesting) {
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestFunction)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                putOperator(tokPtr);
                putTok(tokPtr, TokBypassNesting);
                enterScope(tokPtr, true, StCtrl);
                return;
            } else if (m_tmp == statics.strreturn) {
                if (m_blockstack.top().nest & NestFunction) {
                    if (argc > 1) {
                        bogusTest(tokPtr, fL1S("return() requires zero or one argument."));
                        return;
                    }
                } else {
                    if (*uce != TokFuncTerminator) {
                        bogusTest(tokPtr, fL1S("Top-level return() requires zero arguments."));
                        return;
                    }
                }
                defType = TokReturn;
                goto ctrlstm2;
            } else if (m_tmp == statics.strnext) {
                defType = TokNext;
                goto ctrlstm;
            } else if (m_tmp == statics.strbreak) {
                defType = TokBreak;
              ctrlstm:
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestLoop)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
              ctrlstm2:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                finalizeTest(tokPtr);
                putBlock(tokPtr, uce, ptr - uce - 1); // Only for TokReturn
                putTok(tokPtr, defType);
                return;
            } else if (m_tmp == statics.stroption) {
                if (m_state != StNew || m_blockstack.top().braceLevel || m_blockstack.size() > 1
                        || m_invert || m_operator != NoOperator) {
                    bogusTest(tokPtr, fL1S("option() must appear outside any control structures."));
                    return;
                }
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        m_tmp.setRawData((QChar *)uce + 2, nlen);
                        if (m_tmp == statics.strhost_build)
                            m_proFile->setHostBuild(true);
                        else
                            parseError(fL1S("Unknown option() %1.").arg(m_tmp));
                        return;
                    }
                }
                parseError(fL1S("option() requires one literal argument."));
                return;
            }
        }
    }

    finalizeTest(tokPtr);
    putBlock(tokPtr, uc, ptr - uc);
}